

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav_ins.c
# Opt level: O3

void fsnav_ins_read_raw_input_temp(void)

{
  fsnav_imu *pfVar1;
  fsnav_struct *pfVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  char input_file_token [11];
  char local_28 [16];
  
  builtin_strncpy(local_28,"sensors_in",0xb);
  pfVar1 = fsnav->imu;
  if (pfVar1 == (fsnav_imu *)0x0) {
    return;
  }
  if (fsnav->mode == 0) {
    pcVar4 = fsnav_locate_token(local_28,fsnav->cfg_settings,fsnav->settings_length,'=');
    if (pcVar4 != (char *)0x0) {
      __isoc99_sscanf(pcVar4,"%s",fsnav_ins_read_raw_input_temp::buffer);
    }
    fsnav_ins_read_raw_input_temp::fp = (FILE *)fopen(fsnav_ins_read_raw_input_temp::buffer,"r");
    if ((FILE *)fsnav_ins_read_raw_input_temp::fp != (FILE *)0x0) {
      fgets(fsnav_ins_read_raw_input_temp::buffer,0x1000,(FILE *)fsnav_ins_read_raw_input_temp::fp);
      fsnav_ins_read_raw_input_temp::buffer[0xfff] = '\0';
      return;
    }
    printf("error: couldn\'t open input file \'%s\'.\n",fsnav_ins_read_raw_input_temp::buffer);
  }
  else {
    if (fsnav->mode < 0) {
      if (fsnav_ins_read_raw_input_temp::fp == (FILE *)0x0) {
        return;
      }
      fclose((FILE *)fsnav_ins_read_raw_input_temp::fp);
      return;
    }
    pfVar1->w_valid = '\0';
    pfVar1->f_valid = '\0';
    pcVar4 = fgets(fsnav_ins_read_raw_input_temp::buffer,0x1000,
                   (FILE *)fsnav_ins_read_raw_input_temp::fp);
    if (pcVar4 != (char *)0x0) {
      strtok(fsnav_ins_read_raw_input_temp::buffer,",;");
      lVar5 = 0;
      pcVar4 = strtok((char *)0x0,",;");
      fsnav_ins_read_raw_input_temp::w_raw[0] = atoi(pcVar4);
      pcVar4 = strtok((char *)0x0,",;");
      fsnav_ins_read_raw_input_temp::w_raw[1] = atoi(pcVar4);
      pcVar4 = strtok((char *)0x0,",;");
      fsnav_ins_read_raw_input_temp::w_raw[2] = atoi(pcVar4);
      pcVar4 = strtok((char *)0x0,",;");
      fsnav_ins_read_raw_input_temp::f_raw[0] = atoi(pcVar4);
      pcVar4 = strtok((char *)0x0,",;");
      fsnav_ins_read_raw_input_temp::f_raw[1] = atoi(pcVar4);
      pcVar4 = strtok((char *)0x0,",;");
      fsnav_ins_read_raw_input_temp::f_raw[2] = atoi(pcVar4);
      pcVar4 = strtok((char *)0x0,",;");
      iVar3 = atoi(pcVar4);
      do {
        *(int *)((long)fsnav_ins_read_raw_input_temp::w_raw + lVar5) =
             (int)*(short *)((long)fsnav_ins_read_raw_input_temp::w_raw + lVar5);
        *(int *)((long)fsnav_ins_read_raw_input_temp::f_raw + lVar5) =
             (int)*(short *)((long)fsnav_ins_read_raw_input_temp::f_raw + lVar5);
        pfVar2 = fsnav;
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0xc);
      pfVar1 = fsnav->imu;
      lVar5 = 0;
      do {
        *(double *)((long)pfVar1->w + lVar5 * 2) =
             ((double)*(int *)((long)fsnav_ins_read_raw_input_temp::w_raw + lVar5) * 0.00625) /
             (pfVar2->imu_const).rad2deg;
        *(double *)((long)pfVar1->f + lVar5 * 2) =
             (double)*(int *)((long)fsnav_ins_read_raw_input_temp::f_raw + lVar5) * 0.002447;
        *(double *)((long)pfVar1->Tw + lVar5 * 2) = (double)iVar3 * 0.1;
        *(double *)((long)pfVar1->Tf + lVar5 * 2) = (double)iVar3 * 0.1;
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0xc);
      pfVar1->w_valid = '\x01';
      pfVar1->f_valid = '\x01';
      pfVar1->Tw_valid = '\x01';
      pfVar1->Tf_valid = '\x01';
      return;
    }
  }
  fsnav->mode = -1;
  return;
}

Assistant:

void fsnav_ins_read_raw_input_temp(void)
{
	size_t i;

	const char input_file_token[] = "sensors_in"; // имя параметра конфигурации с входным файлом
	const int  n0 = 7;                            // требуемое количество параметров в строке входного файла
														  
	static FILE *fp = NULL;                       // указатель на файл
	static char  buffer[FSNAV_INS_BUFFER_SIZE];    // строковый буфер

	char       *cfg_ptr;        // указатель на параметр в строке конфигурации
	char       *tkn_ptr;        // указатель на токен в стоке файла
	const char  delim[] = ",;"; // разделители

	// масштабные коэффициенты
#ifdef BIT16
	const double w_scale = 0.00625;
	const double f_scale = 0.002447;
#else
	const double w_scale = 0.00625/pow(2,16);
	const double f_scale = 0.002447/pow(2,16);
#endif
	const double T_scale = 0.1;

	// измерения
	static int w_raw[3];
	static int f_raw[3];
	static int T;

	// проверка инерциальной подсистемы на шине
	if (fsnav->imu == NULL)
		return;

	// инициализация
	if (fsnav->mode == 0) {
		// поиск имени входного файла в конфигурации
		cfg_ptr = fsnav_locate_token(input_file_token, fsnav->cfg_settings, fsnav->settings_length, '=');
		if (cfg_ptr != NULL)
			sscanf(cfg_ptr, "%s", buffer);
		// открытие файла
		fp = fopen(buffer, "r");
		if (fp == NULL) {
			printf("error: couldn't open input file '%s'.\n", buffer);
			fsnav->mode = -1;
			return;
		}
		// считывание заголовка
		fgets(buffer, FSNAV_INS_BUFFER_SIZE, fp);
		// обеспечить завершение строки нулевым символом
		buffer[FSNAV_INS_BUFFER_SIZE-1] = '\0';
	}

	// завершение работы
	else if (fsnav->mode < 0) {
		if (fp != NULL)
			fclose(fp); // закрытие файла, если он был открыт
		return;
	}

	// основной цикл
	else {
		// сброс флагов достоверности показаний датчиков
		fsnav->imu->w_valid = 0;
		fsnav->imu->f_valid = 0;
		// чтение строки из файла
		if (fgets(buffer, FSNAV_INS_BUFFER_SIZE, fp) == NULL) {
			fsnav->mode = -1; // завершение работы, если не удалось прочитать строку
			return;
		}

		// парсинг строки
		// DIAG_STAT
		tkn_ptr = strtok(buffer, delim);
		// X_GYRO
		tkn_ptr = strtok(NULL, delim);
		w_raw[0] = atoi(tkn_ptr);
		// Y_GYRO
		tkn_ptr = strtok(NULL, delim);
		w_raw[1] = atoi(tkn_ptr);
		// Z_GYRO
		tkn_ptr = strtok(NULL, delim);
		w_raw[2] = atoi(tkn_ptr);
		// X_ACCL
		tkn_ptr = strtok(NULL, delim);
		f_raw[0] = atoi(tkn_ptr);
		// Y_ACCL
		tkn_ptr = strtok(NULL, delim);
		f_raw[1] = atoi(tkn_ptr);
		// Z_ACCL
		tkn_ptr = strtok(NULL, delim);
		f_raw[2] = atoi(tkn_ptr);
		// TEMP_OUT
		tkn_ptr = strtok(NULL, delim);
		T = (int)atoi(tkn_ptr);

#ifdef BIT16
		for (i = 0; i < 3; i++) {
			w_raw[i] = (int16_t)w_raw[i];
			f_raw[i] = (int16_t)f_raw[i];
		}
#else
		for (i = 0; i < 3; i++) {
			w_raw[i] = (int32_t)w_raw[i];
			f_raw[i] = (int32_t)f_raw[i];
		}
#endif

		// умножение на масштабный коэффициент + перевод в радианы
		for (i = 0; i < 3; i++) {
			fsnav->imu->w [i] = w_raw[i] * w_scale / fsnav->imu_const.rad2deg;
			fsnav->imu->f [i] = f_raw[i] * f_scale;
			fsnav->imu->Tw[i] = T * T_scale;
			fsnav->imu->Tf[i] = T * T_scale;
		}

		// установка флагов достоверности
		fsnav->imu->w_valid  = 1;
		fsnav->imu->f_valid  = 1;
		fsnav->imu->Tw_valid = 1;
		fsnav->imu->Tf_valid = 1;
	}
}